

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

int pbrt::GenerateLightSubpath
              (Integrator *integrator,SampledWavelengths *lambda,SamplerHandle *sampler,
              CameraHandle *camera,ScratchBuffer *scratchBuffer,int maxDepth,Float time,
              LightSamplerHandle lightSampler,Vertex *path,bool regularize)

{
  float fVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  SampledLight *pSVar7;
  LightLeSample *pLVar8;
  Interaction *intr;
  LightLeSample *this;
  int iVar9;
  Float FVar10;
  type tVar11;
  Point2f PVar12;
  undefined8 extraout_XMM0_Qb;
  undefined1 extraout_var [56];
  undefined1 auVar13 [64];
  undefined1 auVar17 [56];
  undefined1 auVar16 [64];
  SampledSpectrum SVar18;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_350;
  undefined1 local_348 [16];
  ScratchBuffer *local_330;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_328;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_320;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_318;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_310;
  optional<pbrt::SampledLight> sampledLight;
  LightSamplerHandle local_2f0;
  Ray local_2e8;
  uint local_2c0;
  float fStack_2bc;
  undefined8 uStack_2b8;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float fStack_2a0;
  undefined8 uStack_29c;
  undefined8 uStack_294;
  optional<pbrt::LightLeSample> les;
  RayDifferential local_1e8;
  Vertex local_188;
  undefined1 auVar14 [56];
  undefined1 auVar15 [64];
  
  if (maxDepth == 0) {
    iVar6 = 0;
  }
  else {
    local_330 = scratchBuffer;
    FVar10 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
             ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                       ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                         *)sampler);
    LightSamplerHandle::Sample
              (&sampledLight,
               (LightSamplerHandle *)
               lightSampler.
               super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
               .bits,FVar10);
    iVar6 = 0;
    if (sampledLight.set == true) {
      pSVar7 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
      local_350.bits =
           (pSVar7->light).
           super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
           .bits;
      pSVar7 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
      fVar1 = pSVar7->pdf;
      PVar12 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
               ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                         ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                           *)sampler);
      local_348._8_8_ = extraout_XMM0_Qb;
      local_348._0_4_ = PVar12.super_Tuple2<pbrt::Point2,_float>.x;
      local_348._4_4_ = PVar12.super_Tuple2<pbrt::Point2,_float>.y;
      PVar12 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
               ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                         ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                           *)sampler);
      LightHandle::SampleLe
                (&les,(LightHandle *)&local_350,(Point2f)local_348._0_8_,PVar12,lambda,time);
      iVar9 = 0;
      iVar6 = 0;
      if (les.set == true) {
        pLVar8 = pstd::optional<pbrt::LightLeSample>::value(&les);
        iVar6 = iVar9;
        if ((pLVar8->pdfPos != 0.0) || (NAN(pLVar8->pdfPos))) {
          pLVar8 = pstd::optional<pbrt::LightLeSample>::value(&les);
          if ((pLVar8->pdfDir != 0.0) || (NAN(pLVar8->pdfDir))) {
            pLVar8 = pstd::optional<pbrt::LightLeSample>::value(&les);
            bVar5 = SampledSpectrum::operator_cast_to_bool(&pLVar8->L);
            if (bVar5) {
              pLVar8 = pstd::optional<pbrt::LightLeSample>::value(&les);
              local_2e8.o.super_Tuple3<pbrt::Point3,_float>.x =
                   (pLVar8->ray).o.super_Tuple3<pbrt::Point3,_float>.x;
              local_2e8.o.super_Tuple3<pbrt::Point3,_float>.y =
                   (pLVar8->ray).o.super_Tuple3<pbrt::Point3,_float>.y;
              uVar3 = *(undefined8 *)&(pLVar8->ray).o.super_Tuple3<pbrt::Point3,_float>.z;
              uVar2 = (pLVar8->ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
              local_2e8._20_8_ =
                   *(undefined8 *)&(pLVar8->ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
              local_2e8.o.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar3;
              local_2e8.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)((ulong)uVar3 >> 0x20);
              local_2e8.medium.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                       )(pLVar8->ray).medium.
                        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                        .bits;
              local_2c0 = local_2c0 & 0xffffff00;
              fStack_2bc = 0.0;
              uStack_29c._0_4_ = 0.0;
              uStack_29c._4_4_ = 0.0;
              uStack_294._0_4_ = 0.0;
              uStack_294._4_4_ = 0.0;
              uStack_2b8._0_4_ = 0.0;
              uStack_2b8._4_4_ = 0.0;
              fStack_2b0 = 0.0;
              fStack_2ac = 0.0;
              fStack_2a8 = 0.0;
              fStack_2a4 = 0.0;
              fStack_2a0 = 0.0;
              auVar17 = ZEXT856((ulong)local_2e8._20_8_);
              local_2e8.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar2;
              pLVar8 = pstd::optional<pbrt::LightLeSample>::value(&les);
              fVar1 = fVar1 * pLVar8->pdfPos;
              pLVar8 = pstd::optional<pbrt::LightLeSample>::value(&les);
              if ((pLVar8->intr).set == true) {
                local_310.bits = local_350.bits;
                pLVar8 = pstd::optional<pbrt::LightLeSample>::value(&les);
                intr = pstd::optional<pbrt::Interaction>::value(&pLVar8->intr);
                pLVar8 = pstd::optional<pbrt::LightLeSample>::value(&les);
                Vertex::CreateLight(&local_188,(LightHandle *)&local_310,intr,&pLVar8->L,fVar1);
              }
              else {
                local_318.bits = local_350.bits;
                pLVar8 = pstd::optional<pbrt::LightLeSample>::value(&les);
                Vertex::CreateLight(&local_188,(LightHandle *)&local_318,&local_2e8,&pLVar8->L,fVar1
                                   );
              }
              memcpy(path,&local_188,0x158);
              pLVar8 = pstd::optional<pbrt::LightLeSample>::value(&les);
              this = pstd::optional<pbrt::LightLeSample>::value(&les);
              FVar10 = LightLeSample::AbsCosTheta(this,&local_2e8.d);
              auVar14 = extraout_var;
              SVar18 = SampledSpectrum::operator*(&pLVar8->L,FVar10);
              auVar15._0_8_ = SVar18.values.values._8_8_;
              auVar15._8_56_ = auVar17;
              auVar13._0_8_ = SVar18.values.values._0_8_;
              auVar13._8_56_ = auVar14;
              local_188._0_16_ = vmovlhps_avx(auVar13._0_16_,auVar15._0_16_);
              pLVar8 = pstd::optional<pbrt::LightLeSample>::value(&les);
              SVar18 = SampledSpectrum::operator/
                                 ((SampledSpectrum *)&local_188,fVar1 * pLVar8->pdfDir);
              auVar16._0_8_ = SVar18.values.values._8_8_;
              auVar16._8_56_ = auVar17;
              local_348 = auVar16._0_16_;
              local_1e8.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x = fStack_2bc;
              local_1e8._40_4_ = local_2c0;
              local_1e8.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.y =
                   local_2e8.d.super_Tuple3<pbrt::Vector3,_float>.y;
              local_1e8.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z =
                   local_2e8.d.super_Tuple3<pbrt::Vector3,_float>.z;
              local_1e8.super_Ray.time = local_2e8.time;
              local_1e8.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x =
                   local_2e8.o.super_Tuple3<pbrt::Point3,_float>.x;
              local_1e8.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y =
                   local_2e8.o.super_Tuple3<pbrt::Point3,_float>.y;
              local_1e8.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z =
                   local_2e8.o.super_Tuple3<pbrt::Point3,_float>.z;
              local_1e8.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x =
                   local_2e8.d.super_Tuple3<pbrt::Vector3,_float>.x;
              local_1e8.super_Ray.medium.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits = local_2e8.medium.
                      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                      .bits;
              local_1e8.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y = (float)uStack_2b8;
              local_1e8.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z = uStack_2b8._4_4_;
              local_1e8.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x = fStack_2b0;
              local_1e8.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y = fStack_2ac;
              local_1e8.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z = fStack_2a8;
              local_1e8.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x = fStack_2a4;
              local_1e8.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y = fStack_2a0;
              local_1e8.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z = (float)uStack_29c;
              local_1e8.ryDirection.super_Tuple3<pbrt::Vector3,_float>.x = uStack_29c._4_4_;
              local_1e8.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_294;
              local_1e8.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z = uStack_294._4_4_;
              local_320.bits =
                   (sampler->
                   super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   ).bits;
              local_328.bits =
                   (camera->
                   super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                   ).bits;
              pLVar8 = pstd::optional<pbrt::LightLeSample>::value(&les);
              auVar4 = local_348;
              SVar18.values.values[2] = (float)local_348._0_4_;
              SVar18.values.values[3] = (float)local_348._4_4_;
              local_348 = auVar4;
              iVar6 = RandomWalk(integrator,lambda,&local_1e8,(SamplerHandle *)&local_320,
                                 (CameraHandle *)&local_328,local_330,SVar18,pLVar8->pdfDir,
                                 maxDepth + -1,Importance,path + 1,regularize);
              bVar5 = Vertex::IsInfiniteLight(path);
              if (bVar5) {
                if (0 < iVar6) {
                  pLVar8 = pstd::optional<pbrt::LightLeSample>::value(&les);
                  path[1].pdfFwd = pLVar8->pdfPos;
                  bVar5 = Vertex::IsOnSurface(path + 1);
                  if (bVar5) {
                    tVar11 = AbsDot<float>(&local_2e8.d,&path[1].field_2.ei.super_Interaction.n);
                    path[1].pdfFwd = tVar11 * path[1].pdfFwd;
                  }
                }
                local_2f0.
                super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                .bits = *(TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                          *)lightSampler.
                            super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                            .bits;
                FVar10 = InfiniteLightDensity(&integrator->infiniteLights,&local_2f0,&local_2e8.d);
                path->pdfFwd = FVar10;
              }
              iVar6 = iVar6 + 1;
            }
          }
        }
      }
      pstd::optional<pbrt::LightLeSample>::~optional(&les);
    }
    pstd::optional<pbrt::SampledLight>::~optional(&sampledLight);
  }
  return iVar6;
}

Assistant:

int GenerateLightSubpath(const Integrator &integrator, SampledWavelengths &lambda,
                         SamplerHandle sampler, CameraHandle camera,
                         ScratchBuffer &scratchBuffer, int maxDepth, Float time,
                         LightSamplerHandle lightSampler, Vertex *path, bool regularize) {
    // Generate light subpath and initialize _path_ vertices
    if (maxDepth == 0)
        return 0;
    // Sample initial ray for light subpath
    // Sample light for BDPT light subpath
    pstd::optional<SampledLight> sampledLight = lightSampler.Sample(sampler.Get1D());
    if (!sampledLight)
        return 0;
    LightHandle light = sampledLight->light;
    Float lightSamplePDF = sampledLight->pdf;

    Point2f ul0 = sampler.Get2D();
    Point2f ul1 = sampler.Get2D();
    pstd::optional<LightLeSample> les = light.SampleLe(ul0, ul1, lambda, time);
    if (!les || les->pdfPos == 0 || les->pdfDir == 0 || !les->L)
        return 0;
    RayDifferential ray(les->ray);

    // Generate first vertex of light subpath
    Float lightPDF = lightSamplePDF * les->pdfPos;
    path[0] = les->intr ? Vertex::CreateLight(light, *les->intr, les->L, lightPDF)
                        : Vertex::CreateLight(light, ray, les->L, lightPDF);

    // Follow light subpath random walk
    SampledSpectrum beta = les->L * les->AbsCosTheta(ray.d) / (lightPDF * les->pdfDir);
    PBRT_DBG("%s\n",
             StringPrintf(
                 "Starting light subpath. Ray: %s, Le %s, beta %s, pdfPos %f, pdfDir %f",
                 ray, les->L, beta, les->pdfPos, les->pdfDir)
                 .c_str());
    int nVertices = RandomWalk(integrator, lambda, ray, sampler, camera, scratchBuffer,
                               beta, les->pdfDir, maxDepth - 1, TransportMode::Importance,
                               path + 1, regularize);
    // Correct subpath sampling densities for infinite area lights
    if (path[0].IsInfiniteLight()) {
        // Set spatial density of _path[1]_ for infinite area light
        if (nVertices > 0) {
            path[1].pdfFwd = les->pdfPos;
            if (path[1].IsOnSurface())
                path[1].pdfFwd *= AbsDot(ray.d, path[1].ng());
        }

        // Set spatial density of _path[0]_ for infinite area light
        path[0].pdfFwd =
            InfiniteLightDensity(integrator.infiniteLights, lightSampler, ray.d);
    }

    return nVertices + 1;
}